

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong
helper_dextr_s_h_mips64el(target_ulong ac,target_ulong shift,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  target_ulong tVar5;
  
  tVar5 = (env->active_tc).HI[ac & 0xffffffff];
  uVar3 = (env->active_tc).LO[ac & 0xffffffff];
  if ((shift & 0x1f) != 0) {
    bVar4 = (byte)shift & 0x1f;
    uVar3 = uVar3 >> bVar4 | tVar5 << (-((byte)shift & 0x1f) & 0x3f);
    tVar5 = (long)tVar5 >> bVar4;
  }
  if ((long)tVar5 < 0) {
    uVar2 = 0x8000;
    if ((tVar5 == 0xffffffffffffffff) && (0xffffffffffff0fff < uVar3)) goto LAB_0094743b;
  }
  else {
    uVar2 = 0x7fff;
    if ((tVar5 == 0) && ((long)uVar3 < 0x8000)) goto LAB_0094743b;
  }
  uVar3 = uVar2;
  pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
  *pbVar1 = *pbVar1 | 0x80;
LAB_0094743b:
  return (long)(short)uVar3;
}

Assistant:

static inline void mipsdsp_rashift_acc(uint64_t *p,
                                       uint32_t ac,
                                       uint32_t shift,
                                       CPUMIPSState *env)
{
    uint64_t tempB, tempA;

    tempB = env->active_tc.HI[ac];
    tempA = env->active_tc.LO[ac];
    shift = shift & 0x1F;

    if (shift == 0) {
        p[1] = tempB;
        p[0] = tempA;
    } else {
        p[0] = (tempB << (64 - shift)) | (tempA >> shift);
        p[1] = (int64_t)tempB >> shift;
    }
}